

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O2

bool __thiscall
psy::C::SyntaxWriterDOTFormat::preVisit(SyntaxWriterDOTFormat *this,SyntaxNode *node)

{
  int __val;
  mapped_type *pmVar1;
  _Elt_pointer ppSVar2;
  SyntaxNode *node_local;
  string id;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  __val = this->count_;
  this->count_ = __val + 1;
  node_local = node;
  std::__cxx11::to_string(&local_50.first,__val);
  std::operator+(&id,'n',&local_50.first);
  std::__cxx11::string::~string((string *)&local_50);
  pmVar1 = std::__detail::
           _Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->id_,&node_local);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  ppSVar2 = (this->nodes_).c.
            super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar2 !=
      (this->nodes_).c.
      super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar2 ==
        (this->nodes_).c.
        super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar2 = (this->nodes_).c.
                super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pmVar1 = std::__detail::
             _Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->id_,ppSVar2 + -1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_50,pmVar1,&id);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->connections_,&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_50);
  }
  std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>::push_back
            (&(this->nodes_).c,&node_local);
  nodeLabel(this,node_local);
  std::__cxx11::string::~string((string *)&id);
  return true;
}

Assistant:

bool SyntaxWriterDOTFormat::preVisit(const SyntaxNode* node)
{
    const std::string id = 'n' + std::to_string(count_++);
    id_[node] = id;

    if (!nodes_.empty())
        connections_.push_back(std::make_pair(id_[nodes_.top()], id));

    nodes_.push(node);

    nodeLabel(node);

    return true;
}